

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  ulong uVar1;
  pointer paVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Bit_pointer puVar5;
  bool bVar6;
  handle hVar7;
  bool bVar8;
  argument_record aVar9;
  function_record *pfVar10;
  type_info *find_type;
  long lVar11;
  handle hVar12;
  pointer pfVar13;
  _Bit_type *p_Var14;
  byte bVar15;
  PyObject *tmp;
  ulong uVar16;
  _Bit_type *p_Var17;
  ulong uVar18;
  PyTypeObject **value;
  size_type __new_size;
  char *pcVar19;
  char cVar20;
  ulong uVar21;
  pointer pfVar22;
  function_record *f;
  pointer pfVar23;
  ulong uVar24;
  pointer paVar25;
  function_record *pfVar26;
  reference rVar27;
  anon_class_1_0_00000001 append_note_if_missing_header_is_suspected;
  handle arg;
  handle hStack_1c0;
  undefined1 auStack_1b8 [16];
  _Bit_pointer local_1a8;
  vector<bool,_std::allocator<bool>_> second_pass_convert;
  PyObject *local_160;
  int local_158;
  dict kwargs_1;
  dict kwargs;
  instance *pi;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  loader_life_support guard_1;
  undefined1 auStack_d8 [24];
  undefined1 local_c0 [16];
  pointer local_b0;
  handle hStack_a8;
  _Bit_pointer local_a0;
  object local_98;
  object local_90 [2];
  handle local_80;
  value_and_holder self_value_and_holder;
  object local_50;
  PyTypeObject **local_48;
  handle local_40 [2];
  
  pfVar10 = (function_record *)PyCapsule_GetPointer(self,0);
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/daniellasry[P]CPPTest/pybind11/include/pybind11/pybind11.h"
                  ,0x1ac,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  uVar1 = args_in[1].ob_refcnt;
  if (uVar1 == 0) {
    pi = (instance *)0x0;
  }
  else {
    pi = (instance *)args_in[1].ob_type;
  }
  self_value_and_holder.inst = (instance *)0x0;
  if ((pfVar10->field_0x59 & 1) != 0) {
    find_type = detail::get_type_info((PyTypeObject *)(pfVar10->scope).m_ptr);
    detail::instance::get_value_and_holder((value_and_holder *)&guard_1,pi,find_type,false);
    self_value_and_holder.type._0_4_ = auStack_d8._8_4_;
    self_value_and_holder.type._4_4_ = auStack_d8._12_4_;
    self_value_and_holder.vh._0_4_ = auStack_d8._16_4_;
    self_value_and_holder.vh._4_4_ = auStack_d8._20_4_;
    self_value_and_holder.inst = (instance *)_guard_1;
    self_value_and_holder.index._0_4_ = auStack_d8._0_4_;
    self_value_and_holder.index._4_4_ = auStack_d8._4_4_;
    if ((CONCAT44(auStack_d8._12_4_,auStack_d8._8_4_) == 0) ||
       ((function_record *)_guard_1 == (function_record *)0x0)) {
      PyErr_SetString(_PyExc_TypeError,"__init__(self, ...) called with invalid `self` argument");
      return (PyObject *)0x0;
    }
    bVar8 = detail::value_and_holder::instance_registered(&self_value_and_holder);
    if (bVar8) {
      __Py_NoneStruct = __Py_NoneStruct + 1;
      _guard_1 = (pointer)0x0;
      object::~object((object *)&guard_1);
      return (PyObject *)&_Py_NoneStruct;
    }
  }
  second_pass.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  second_pass.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  second_pass.
  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pfVar26 = pfVar10->next;
  local_48 = &args_in[1].ob_type;
  local_160 = (PyObject *)0x1;
  for (f = pfVar10; f != (function_record *)0x0; f = f->next) {
    bVar15 = (f->field_0x59 & 0x10) >> 4;
    uVar24 = (long)((char)(f->field_0x59 << 2) >> 7) + ((ulong)f->nargs - (ulong)bVar15);
    if (((bVar15 != 0) || (uVar1 <= uVar24)) &&
       ((uVar24 <= uVar1 ||
        (uVar24 <= (ulong)((long)(f->args).
                                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(f->args).
                                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5))))) {
      detail::function_call::function_call((function_call *)&guard_1,f,(handle)pi);
      uVar16 = uVar24;
      if (uVar1 < uVar24) {
        uVar16 = uVar1;
      }
      if ((f->field_0x59 & 2) == 0) {
        uVar18 = 0;
      }
      else {
        if (*(long *)CONCAT44(self_value_and_holder.vh._4_4_,self_value_and_holder.vh._0_4_) != 0) {
          (**(code **)(CONCAT44(self_value_and_holder.type._4_4_,self_value_and_holder.type._0_4_) +
                      0x38))(&self_value_and_holder);
        }
        if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/daniellasry[P]CPPTest/pybind11/include/pybind11/pybind11.h"
                        ,0x1f8,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        local_80.m_ptr = (PyObject *)args_in[1].ob_type;
        arg.m_ptr = (PyObject *)&self_value_and_holder;
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::
        emplace_back<pybind11::handle>
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_d8,&arg);
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)local_c0,false);
        uVar18 = 1;
      }
      uVar21 = (ulong)(uint)((int)uVar18 << 5);
      for (; uVar18 < uVar16; uVar18 = uVar18 + 1) {
        paVar2 = (f->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar18 < (ulong)((long)(f->args).
                                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 5))
        {
          paVar25 = paVar2 + uVar21;
          bVar8 = paVar2 != (pointer)0x0;
          if ((((kwargs_in == (PyObject *)0x0) || (paVar2 == (pointer)0x0)) ||
              (bVar8 = true, *(long *)paVar25 == 0)) ||
             (lVar11 = PyDict_GetItemString(kwargs_in), lVar11 == 0)) goto LAB_0010cbe7;
LAB_0010cd68:
          bVar8 = false;
          goto LAB_0010d114;
        }
        bVar8 = false;
        paVar25 = (pointer)0x0;
LAB_0010cbe7:
        if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/daniellasry[P]CPPTest/pybind11/include/pybind11/pybind11.h"
                        ,0x207,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        arg.m_ptr = (PyObject *)(&args_in[1].ob_type)[uVar18];
        if (((bVar8) && (((byte)paVar25[0x18] & 2) == 0)) &&
           ((PyTypeObject *)arg.m_ptr == (PyTypeObject *)&_Py_NoneStruct)) goto LAB_0010cd68;
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_d8,&arg);
        aVar9 = (argument_record)0x1;
        if (bVar8) {
          aVar9 = paVar25[0x18];
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)local_c0,(bool)((byte)aVar9 & 1));
        uVar21 = uVar21 + 0x20;
      }
      if (kwargs_in != (PyObject *)0x0) {
        kwargs_in->ob_refcnt = kwargs_in->ob_refcnt + 1;
      }
      kwargs.super_object.super_handle.m_ptr = (object)(object)kwargs_in;
      if (uVar18 < uVar24) {
        bVar8 = false;
        for (; uVar18 < uVar24; uVar18 = uVar18 + 1) {
          paVar2 = (f->args).
                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          arg.m_ptr = (PyObject *)0x0;
          if (((kwargs_in == (PyObject *)0x0) || (*(long *)(paVar2 + uVar21) == 0)) ||
             (arg.m_ptr = (PyObject *)PyDict_GetItemString(kwargs.super_object.super_handle.m_ptr),
             arg.m_ptr == (PyObject *)0x0)) {
            hVar7.m_ptr = *(PyObject **)(paVar2 + uVar21 + 0x10);
            hVar12.m_ptr = arg.m_ptr;
          }
          else {
            if (!bVar8) {
              second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                   (_Bit_type *)PyDict_Copy(kwargs.super_object.super_handle.m_ptr);
              object::operator=(&kwargs.super_object,(object *)&second_pass_convert);
              object::~object((object *)&second_pass_convert);
            }
            PyDict_DelItemString
                      (kwargs.super_object.super_handle.m_ptr,*(undefined8 *)(paVar2 + uVar21));
            bVar8 = true;
            hVar7 = arg;
            hVar12 = arg;
          }
          arg.m_ptr = hVar7.m_ptr;
          if (arg.m_ptr == (PyObject *)0x0) {
            bVar8 = false;
            arg.m_ptr = hVar12.m_ptr;
            goto LAB_0010d107;
          }
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_d8,&arg)
          ;
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_c0,
                     (bool)((byte)paVar2[uVar21 + 0x18] & 1));
          uVar21 = uVar21 + 0x20;
        }
      }
      if ((handle)kwargs.super_object.super_handle.m_ptr == (handle)0x0) {
        bVar15 = f->field_0x59;
LAB_0010cdb7:
        if ((bVar15 & 0x10) != 0) {
          tuple::tuple((tuple *)&second_pass_convert,0);
          if (uVar16 == 0) {
            args_in->ob_refcnt = args_in->ob_refcnt + 1;
            arg.m_ptr = args_in;
LAB_0010ce92:
            object::operator=((object *)&second_pass_convert,(object *)&arg);
            object::~object((object *)&arg);
          }
          else {
            pfVar23 = (pointer)(uVar1 - uVar18);
            if (uVar1 < uVar18 || pfVar23 == (pointer)0x0) {
              tuple::tuple((tuple *)&arg,0);
              goto LAB_0010ce92;
            }
            tuple::tuple((tuple *)&arg,(size_t)pfVar23);
            object::operator=((object *)&second_pass_convert,(object *)&arg);
            object::~object((object *)&arg);
            value = local_48 + uVar18;
            pfVar13 = (pointer)0x0;
            while (pfVar22 = pfVar13, pfVar23 != pfVar22) {
              if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/daniellasry[P]CPPTest/pybind11/include/pybind11/pybind11.h"
                              ,0x248,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              hStack_1c0.m_ptr =
                   (PyObject *)
                   second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              auStack_1b8._8_8_ = (PyObject *)0x0;
              detail::accessor<pybind11::detail::accessor_policies::tuple_item>::operator=
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&arg,
                         (_object **)value);
              object::~object((object *)(auStack_1b8 + 8));
              value = value + 1;
              auStack_1b8._0_8_ = pfVar22;
              pfVar13 = (pointer)((long)&pfVar22->func + 1);
            }
          }
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_d8,
                     (value_type *)&second_pass_convert);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_c0,false);
          object::operator=(&local_98,(object *)&second_pass_convert);
          object::~object((object *)&second_pass_convert);
          bVar15 = f->field_0x59;
        }
        if ((bVar15 & 0x20) != 0) {
          if ((handle)kwargs.super_object.super_handle.m_ptr == (handle)0x0) {
            dict::dict((dict *)&arg);
            object::operator=(&kwargs.super_object,(object *)&arg);
            object::~object((object *)&arg);
          }
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_d8,
                     (value_type *)&kwargs);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_c0,false);
          object::operator=(local_90,&kwargs.super_object);
        }
        __new_size = CONCAT44(auStack_d8._12_4_,auStack_d8._8_4_) -
                     CONCAT44(auStack_d8._4_4_,auStack_d8._0_4_) >> 3;
        if ((__new_size != f->nargs) ||
           (((ulong)hStack_a8.m_ptr & 0xffffffff) + ((long)local_b0 - local_c0._0_8_) * 8 !=
            __new_size)) {
          pybind11_fail(
                       "Internal error: function call dispatcher inserted wrong number of arguments!"
                       );
        }
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ =
             second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ =
             second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
        second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
        if (pfVar26 != (function_record *)0x0) {
          std::vector<bool,_std::allocator<bool>_>::resize(&second_pass_convert,__new_size,false);
          puVar5 = local_a0;
          hVar12.m_ptr = hStack_a8.m_ptr;
          pfVar23 = local_b0;
          uVar4 = local_c0._8_8_;
          uVar3 = local_c0._0_8_;
          local_1a8 = local_a0;
          auStack_1b8._0_8_ = local_b0;
          auStack_1b8._8_8_ = hStack_a8.m_ptr;
          arg.m_ptr = (PyObject *)local_c0._0_8_;
          hStack_1c0.m_ptr = (PyObject *)local_c0._8_8_;
          local_a0 = second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage;
          local_b0 = (pointer)second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl
                              .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          hStack_a8.m_ptr =
               (PyObject *)
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_;
          local_c0._0_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          local_c0._8_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = puVar5;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)pfVar23;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ = hVar12.m_ptr;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)uVar3;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = uVar4;
        }
        detail::loader_life_support::loader_life_support((loader_life_support *)&arg);
        local_160 = (PyObject *)(*f->impl)((function_call *)&guard_1);
        detail::loader_life_support::~loader_life_support((loader_life_support *)&arg);
        bVar8 = local_160 != (PyObject *)0x1;
        if (pfVar26 != (function_record *)0x0 && !bVar8) {
          uVar16 = (ulong)((byte)f->field_0x59 >> 6 & 1);
          do {
            if (uVar24 <= uVar16) goto LAB_0010d0fb;
            rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&second_pass_convert,uVar16);
            puVar5 = local_a0;
            hVar12.m_ptr = hStack_a8.m_ptr;
            pfVar23 = local_b0;
            uVar4 = local_c0._8_8_;
            uVar3 = local_c0._0_8_;
            uVar16 = uVar16 + 1;
          } while ((*rVar27._M_p & rVar27._M_mask) == 0);
          local_1a8 = local_a0;
          auStack_1b8._0_8_ = local_b0;
          auStack_1b8._8_8_ = hStack_a8.m_ptr;
          arg.m_ptr = (PyObject *)local_c0._0_8_;
          hStack_1c0.m_ptr = (PyObject *)local_c0._8_8_;
          local_a0 = second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage;
          local_b0 = (pointer)second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl
                              .super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          hStack_a8.m_ptr =
               (PyObject *)
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_;
          local_c0._0_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          local_c0._8_8_ =
               second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = puVar5;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)pfVar23;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ = hVar12.m_ptr;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)uVar3;
          second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ = uVar4;
          std::
          vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          ::emplace_back<pybind11::detail::function_call>(&second_pass,(function_call *)&guard_1);
LAB_0010d0fb:
          bVar8 = false;
        }
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&second_pass_convert.super__Bvector_base<std::allocator<bool>_>);
      }
      else {
        lVar11 = PyDict_Size();
        bVar15 = f->field_0x59;
        if ((lVar11 == 0) || ((bVar15 & 0x20) != 0)) goto LAB_0010cdb7;
        bVar8 = false;
      }
LAB_0010d107:
      object::~object(&kwargs.super_object);
LAB_0010d114:
      detail::function_call::~function_call((function_call *)&guard_1);
      if (bVar8) break;
    }
  }
  pfVar23 = second_pass.
            super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  hVar12.m_ptr = local_160;
  if (((pfVar26 != (function_record *)0x0) &&
      (second_pass.
       super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       second_pass.
       super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
       ._M_impl.super__Vector_impl_data._M_finish)) && (local_160 == (PyObject *)0x1)) {
    local_160 = (PyObject *)0x1;
    for (pfVar13 = second_pass.
                   super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                   ._M_impl.super__Vector_impl_data._M_start; hVar12.m_ptr = local_160,
        pfVar13 != pfVar23; pfVar13 = pfVar13 + 1) {
      detail::loader_life_support::loader_life_support(&guard_1);
      hVar12 = (*pfVar13->func->impl)(pfVar13);
      detail::loader_life_support::~loader_life_support(&guard_1);
      if (hVar12.m_ptr != (PyObject *)0x1) break;
    }
  }
  local_160 = hVar12.m_ptr;
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector(&second_pass);
  if (local_160 == (PyObject *)0x0) {
    std::__cxx11::string::string
              ((string *)&guard_1,
               "Unable to convert function return value to a Python type! The signature was\n\t",
               (allocator *)&arg);
    std::__cxx11::string::append((char *)&guard_1);
    dispatcher::anon_class_1_0_00000001::operator()
              (&append_note_if_missing_header_is_suspected,(string *)&guard_1);
    PyErr_SetString(_PyExc_TypeError,_guard_1);
  }
  else {
    if (local_160 != (PyObject *)0x1) {
      if ((pfVar10->field_0x59 & 1) == 0) {
        return local_160;
      }
      bVar8 = detail::value_and_holder::holder_constructed(&self_value_and_holder);
      if (!bVar8) {
        (**(code **)(CONCAT44(self_value_and_holder.type._4_4_,self_value_and_holder.type._0_4_) +
                    0x30))(pi,0);
        return local_160;
      }
      return local_160;
    }
    if ((pfVar10->field_0x59 & 8) != 0) {
      __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
      return (PyObject *)&_Py_NotImplementedStruct;
    }
    std::__cxx11::string::string((string *)&second_pass,pfVar10->name,(allocator *)&kwargs_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &second_pass_convert,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&second_pass
                   ,"(): incompatible ");
    pcVar19 = "function";
    if ((pfVar10->field_0x59 & 1) != 0) {
      pcVar19 = "constructor";
    }
    std::__cxx11::string::string((string *)&kwargs,pcVar19,(allocator *)&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &second_pass_convert,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&kwargs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&guard_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg,
                   " arguments. The following argument types are supported:\n");
    std::__cxx11::string::~string((string *)&arg);
    std::__cxx11::string::~string((string *)&kwargs);
    std::__cxx11::string::~string((string *)&second_pass_convert);
    std::__cxx11::string::~string((string *)&second_pass);
    local_158 = 1;
    for (pfVar26 = pfVar10; pfVar26 != (function_record *)0x0; pfVar26 = pfVar26->next) {
      std::__cxx11::to_string((string *)&second_pass,local_158);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &second_pass_convert,"    ",(string *)&second_pass);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &second_pass_convert,". ");
      std::__cxx11::string::append((string *)&guard_1);
      std::__cxx11::string::~string((string *)&arg);
      std::__cxx11::string::~string((string *)&second_pass_convert);
      std::__cxx11::string::~string((string *)&second_pass);
      if ((pfVar10->field_0x59 & 1) == 0) {
LAB_0010d4be:
        std::__cxx11::string::append((char *)&guard_1);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&arg,pfVar26->signature,(allocator *)&second_pass_convert);
        cVar20 = (char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arg;
        lVar11 = std::__cxx11::string::find(cVar20,0x28);
        pfVar23 = (pointer)(lVar11 + 7);
        if (hStack_1c0.m_ptr <= pfVar23) {
LAB_0010d4b3:
          std::__cxx11::string::~string((string *)&arg);
          goto LAB_0010d4be;
        }
        pfVar13 = (pointer)std::__cxx11::string::find((char *)&arg,0x113f53);
        std::__cxx11::string::rfind((char *)&arg,0x113f56);
        if (pfVar13 < hStack_1c0.m_ptr) {
          pfVar22 = (pointer)((long)&pfVar13->func + 2);
        }
        else {
          pfVar13 = (pointer)std::__cxx11::string::find(cVar20,0x29);
          pfVar22 = pfVar13;
        }
        if ((pfVar13 <= pfVar23) || (hStack_1c0.m_ptr <= pfVar22)) goto LAB_0010d4b3;
        std::__cxx11::string::append((string *)&guard_1,(ulong)&arg,(ulong)pfVar23);
        std::__cxx11::string::push_back((char)(string *)&guard_1);
        std::__cxx11::string::append((string *)&guard_1,(ulong)&arg,(ulong)pfVar22);
        std::__cxx11::string::~string((string *)&arg);
      }
      std::__cxx11::string::append((char *)&guard_1);
      local_158 = local_158 + 1;
    }
    std::__cxx11::string::append((char *)&guard_1);
    args_in->ob_refcnt = args_in->ob_refcnt + 1;
    bVar8 = false;
    kwargs.super_object.super_handle.m_ptr = (object)(object)args_in;
    for (p_Var17 = (_Bit_type *)(ulong)((byte)pfVar10->field_0x59 & 1);
        p_Var14 = (_Bit_type *)PyTuple_Size(kwargs.super_object.super_handle.m_ptr),
        p_Var17 < p_Var14; p_Var17 = (_Bit_type *)((long)p_Var17 + 1)) {
      bVar6 = true;
      if (bVar8) {
        std::__cxx11::string::append((char *)&guard_1);
        bVar6 = bVar8;
      }
      bVar8 = bVar6;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ =
           kwargs.super_object.super_handle.m_ptr;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
      second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var17;
      detail::accessor::operator_cast_to_object((accessor *)&kwargs_1);
      repr((pybind11 *)&second_pass,(handle)kwargs_1.super_object.super_handle.m_ptr);
      str::operator_cast_to_string((string *)&arg,(str *)&second_pass);
      std::__cxx11::string::append((string *)&guard_1);
      std::__cxx11::string::~string((string *)&arg);
      object::~object((object *)&second_pass);
      object::~object((object *)&kwargs_1);
      object::~object((object *)
                      &second_pass_convert.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
    }
    if (kwargs_in != (PyObject *)0x0) {
      kwargs_in->ob_refcnt = kwargs_in->ob_refcnt + 1;
      kwargs_1.super_object.super_handle.m_ptr = (object)(object)kwargs_in;
      lVar11 = PyDict_Size();
      if (lVar11 != 0) {
        if (bVar8) {
          std::__cxx11::string::append((char *)&guard_1);
        }
        std::__cxx11::string::append((char *)&guard_1);
        dict::begin((dict_iterator *)&arg,&kwargs_1);
        bVar8 = true;
        while ((PyObject *)auStack_1b8._8_8_ != (PyObject *)0xffffffffffffffff) {
          second_pass.
          super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)hStack_1c0.m_ptr;
          second_pass.
          super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_1b8._0_8_;
          if (!bVar8) {
            std::__cxx11::string::append((char *)&guard_1);
          }
          str::str((str *)local_40,"{}={!r}");
          str::format<pybind11::handle&,pybind11::handle&>
                    ((str *)&local_50,local_40,(handle *)&second_pass);
          str::operator_cast_to_string((string *)&second_pass_convert,(str *)&local_50);
          std::__cxx11::string::append((string *)&guard_1);
          std::__cxx11::string::~string((string *)&second_pass_convert);
          object::~object(&local_50);
          object::~object((object *)local_40);
          bVar8 = false;
          detail::iterator_policies::dict_readonly::increment((dict_readonly *)&arg);
        }
      }
      object::~object(&kwargs_1.super_object);
    }
    dispatcher::anon_class_1_0_00000001::operator()
              (&append_note_if_missing_header_is_suspected,(string *)&guard_1);
    PyErr_SetString(_PyExc_TypeError,_guard_1);
    object::~object(&kwargs.super_object);
  }
  std::__cxx11::string::~string((string *)&guard_1);
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        const function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                              *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const size_t n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        auto self_value_and_holder = value_and_holder();
        if (overloads->is_constructor) {
            const auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
            const auto pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder = pi->get_value_and_holder(tinfo, false);

            if (!self_value_and_holder.type || !self_value_and_holder.inst) {
                PyErr_SetString(PyExc_TypeError, "__init__(self, ...) called with invalid `self` argument");
                return nullptr;
            }

            // If this value is already registered it must mean __init__ is invoked multiple times;
            // we really can't support that in C++, so just ignore the second __init__.
            if (self_value_and_holder.instance_registered())
                return none().release().ptr();
        }

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                const function_record &func = *it;
                size_t pos_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --pos_args;   // (but don't count py::args
                if (func.has_kwargs) --pos_args; //  or py::kwargs)

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = std::min(pos_args, n_args_in);
                size_t args_copied = 0;

                // 0. Inject new-style `self` argument
                if (func.is_new_style_constructor) {
                    // The `value` may have been preallocated by an old-style `__init__`
                    // if it was a preceding candidate for overload resolution.
                    if (self_value_and_holder)
                        self_value_and_holder.type->dealloc(self_value_and_holder);

                    call.init_self = PyTuple_GET_ITEM(args_in, 0);
                    call.args.push_back(reinterpret_cast<PyObject *>(&self_value_and_holder));
                    call.args_convert.push_back(false);
                    ++args_copied;
                }

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    const argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < pos_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < pos_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < pos_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && kwargs.size() > 0 && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                if (func.has_args) {
                    tuple extra_args;
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            extra_args[i] = PyTuple_GET_ITEM(args_in, args_copied + i);
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                    call.args_ref = std::move(extra_args);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                    call.kwargs_ref = std::move(kwargs);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    loader_life_support guard{};
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        loader_life_support guard{};
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD) {
                        // The error reporting logic below expects 'it' to be valid, as it would be
                        // if we'd encountered this failure in the first-pass loop.
                        if (!result)
                            it = &call.func;
                        break;
                    }
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        auto append_note_if_missing_header_is_suspected = [](std::string &msg) {
            if (msg.find("std::") != std::string::npos) {
                msg += "\n\n"
                       "Did you forget to `#include <pybind11/stl.h>`? Or <pybind11/complex.h>,\n"
                       "<pybind11/functional.h>, <pybind11/chrono.h>, etc. Some automatic\n"
                       "conversions are optional and require extra headers to be included\n"
                       "when compiling your pybind11 module.";
            }
        };

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (const function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                msg += pybind11::repr(args_[ti]);
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (kwargs.size() > 0) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}={!r}").format(kwarg.first, kwarg.second);
                    }
                }
            }

            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor && !self_value_and_holder.holder_constructed()) {
                auto *pi = reinterpret_cast<instance *>(parent.ptr());
                self_value_and_holder.type->init_instance(pi, nullptr);
            }
            return result.ptr();
        }
    }